

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

string * __thiscall
t_swift_generator::enum_const_name
          (string *__return_storage_ptr__,t_swift_generator *this,string *enum_identifier)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  size_type sVar4;
  
  pcVar1 = (enum_identifier->_M_dataplus)._M_p;
  sVar2 = enum_identifier->_M_string_length;
  for (sVar4 = 0; (pcVar1 + sVar4 < pcVar1 + sVar2 && (pcVar1[sVar4] != '.')); sVar4 = sVar4 + 1) {
  }
  for (; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    iVar3 = tolower((int)pcVar1[sVar4]);
    pcVar1[sVar4] = (char)iVar3;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)enum_identifier);
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::enum_const_name(string enum_identifier) {
  string::iterator it;
  for (it = enum_identifier.begin(); it < enum_identifier.end(); ++it) {
    if ((*it) == '.') {
      break;
    }
  }
  std::transform(it, enum_identifier.end(), it, ::tolower);
  return enum_identifier;
}